

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

void If_DsdManPrintDecs(FILE *pFile,If_DsdMan_t *p)

{
  int iVar1;
  int iVar2;
  int b;
  Vec_Int_t *pVVar3;
  word *pwVar4;
  word *pTruth;
  int pCounts [15] [18];
  int local_f8 [2];
  int pCountsSSizes [15];
  int pCountsAll [15];
  int pDecMax [15];
  int local_34;
  int nDecMax;
  int nSuppSize;
  int v;
  int k;
  int i;
  Vec_Int_t *vDecs;
  If_DsdMan_t *p_local;
  FILE *pFile_local;
  
  local_34 = 0;
  memset(pCountsAll + 0xe,0,0x3c);
  memset(pCountsSSizes + 0xe,0,0x3c);
  memset(local_f8,0,0x3c);
  memset(&pTruth,0,0x438);
  nDecMax = 3;
  while( true ) {
    if (p->nVars < nDecMax) {
      fprintf((FILE *)pFile," N :  ");
      fprintf((FILE *)pFile," Total  ");
      for (nSuppSize = 0; nSuppSize < 0x11; nSuppSize = nSuppSize + 1) {
        fprintf((FILE *)pFile,"%6d",(ulong)(uint)nSuppSize);
      }
      fprintf((FILE *)pFile,"  ");
      fprintf((FILE *)pFile,"  More");
      fprintf((FILE *)pFile,"     Ave");
      fprintf((FILE *)pFile,"     Max");
      fprintf((FILE *)pFile,"\n");
      for (v = 0; v <= p->nVars; v = v + 1) {
        fprintf((FILE *)pFile,"%2d :  ",(ulong)(uint)v);
        fprintf((FILE *)pFile,"%6d  ",(ulong)(uint)pCountsSSizes[(long)v + 0xe]);
        for (nSuppSize = 0; nSuppSize < 0x11; nSuppSize = nSuppSize + 1) {
          iVar1 = pCounts[(long)v + -1][(long)nSuppSize + 0x10];
          iVar2 = Abc_MaxInt(1,pCountsSSizes[(long)v + 0xe]);
          fprintf((FILE *)pFile,"%6.1f",((double)iVar1 * 100.0) / (double)iVar2);
        }
        fprintf((FILE *)pFile,"  ");
        iVar1 = pCounts[(long)v + -1][(long)nSuppSize + 0x10];
        iVar2 = Abc_MaxInt(1,pCountsSSizes[(long)v + 0xe]);
        fprintf((FILE *)pFile,"%6.1f",((double)iVar1 * 100.0) / (double)iVar2);
        fprintf((FILE *)pFile,"  ");
        iVar1 = pCountsSSizes[(long)v + -2];
        iVar2 = Abc_MaxInt(1,pCountsSSizes[(long)v + 0xe]);
        fprintf((FILE *)pFile,"%6.1f",((double)iVar1 * 1.0) / (double)iVar2);
        fprintf((FILE *)pFile,"  ");
        fprintf((FILE *)pFile,"%6d",(ulong)(uint)pCountsAll[(long)v + 0xe]);
        fprintf((FILE *)pFile,"\n");
      }
      return;
    }
    iVar1 = Vec_MemEntryNum(p->vTtMem[nDecMax]);
    iVar2 = Vec_PtrSize(p->vTtDecs[nDecMax]);
    if (iVar1 != iVar2) break;
    for (v = 0; iVar1 = Vec_PtrSize(p->vTtDecs[nDecMax]), v < iVar1; v = v + 1) {
      pVVar3 = (Vec_Int_t *)Vec_PtrEntry(p->vTtDecs[nDecMax],v);
      pwVar4 = Vec_MemReadEntry(p->vTtMem[nDecMax],v);
      iVar2 = Abc_TtSupportSize(pwVar4,p->nVars);
      iVar1 = pCountsAll[(long)iVar2 + 0xe];
      b = Vec_IntSize(pVVar3);
      iVar1 = Abc_MaxInt(iVar1,b);
      pCountsAll[(long)iVar2 + 0xe] = iVar1;
      iVar1 = Vec_IntSize(pVVar3);
      local_34 = Abc_MaxInt(local_34,iVar1);
    }
    for (v = 0; iVar1 = Vec_PtrSize(p->vTtDecs[nDecMax]), v < iVar1; v = v + 1) {
      pVVar3 = (Vec_Int_t *)Vec_PtrEntry(p->vTtDecs[nDecMax],v);
      pwVar4 = Vec_MemReadEntry(p->vTtMem[nDecMax],v);
      iVar1 = Abc_TtSupportSize(pwVar4,p->nVars);
      pCountsSSizes[(long)iVar1 + 0xe] = pCountsSSizes[(long)iVar1 + 0xe] + 1;
      iVar2 = Vec_IntSize(pVVar3);
      pCountsSSizes[(long)iVar1 + -2] = iVar2 + pCountsSSizes[(long)iVar1 + -2];
      iVar2 = Vec_IntSize(pVVar3);
      iVar2 = Abc_MinInt(0x11,iVar2);
      pCounts[(long)iVar1 + -1][(long)iVar2 + 0x10] =
           pCounts[(long)iVar1 + -1][(long)iVar2 + 0x10] + 1;
    }
    nDecMax = nDecMax + 1;
  }
  __assert_fail("Vec_MemEntryNum(p->vTtMem[v]) == Vec_PtrSize(p->vTtDecs[v])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDsd.c"
                ,0x215,"void If_DsdManPrintDecs(FILE *, If_DsdMan_t *)");
}

Assistant:

void If_DsdManPrintDecs( FILE * pFile, If_DsdMan_t * p )
{
    Vec_Int_t * vDecs;
    int i, k, v, nSuppSize, nDecMax = 0;
    int pDecMax[IF_MAX_FUNC_LUTSIZE] = {0};
    int pCountsAll[IF_MAX_FUNC_LUTSIZE] = {0};
    int pCountsSSizes[IF_MAX_FUNC_LUTSIZE] = {0};
    int pCounts[IF_MAX_FUNC_LUTSIZE][DSD_ARRAY_LIMIT+2] = {{0}};
    word * pTruth;
    for ( v = 3; v <= p->nVars; v++ )
    {
        assert( Vec_MemEntryNum(p->vTtMem[v]) == Vec_PtrSize(p->vTtDecs[v]) );
        // find max number of decompositions
        Vec_PtrForEachEntry( Vec_Int_t *, p->vTtDecs[v], vDecs, i )
        {
            pTruth = Vec_MemReadEntry( p->vTtMem[v], i );
            nSuppSize = Abc_TtSupportSize( pTruth, p->nVars );
            pDecMax[nSuppSize] = Abc_MaxInt( pDecMax[nSuppSize], Vec_IntSize(vDecs) );
            nDecMax = Abc_MaxInt( nDecMax, Vec_IntSize(vDecs) );
        }
        // fill up
        Vec_PtrForEachEntry( Vec_Int_t *, p->vTtDecs[v], vDecs, i )
        {
            pTruth = Vec_MemReadEntry( p->vTtMem[v], i );
            nSuppSize = Abc_TtSupportSize( pTruth, p->nVars );
            pCountsAll[nSuppSize]++;
            pCountsSSizes[nSuppSize] += Vec_IntSize(vDecs);
            pCounts[nSuppSize][Abc_MinInt(DSD_ARRAY_LIMIT+1,Vec_IntSize(vDecs))]++;
    //        pCounts[nSuppSize][Abc_MinInt(DSD_ARRAY_LIMIT+1,Vec_IntSize(vDecs)?1+(Vec_IntSize(vDecs)/10):0)]++;
    /*
            if ( nSuppSize == 6 && Vec_IntSize(vDecs) == pDecMax[6] )
            {
                fprintf( pFile, "0x" );
                Abc_TtPrintHex( pTruth, nSuppSize );
                Dau_DecPrintSets( vDecs, nSuppSize );
            }
    */
        }
    }
    // print header
    fprintf( pFile, " N :  " );
    fprintf( pFile, " Total  " );
    for ( k = 0; k <= DSD_ARRAY_LIMIT; k++ )
        fprintf( pFile, "%6d", k );
    fprintf( pFile, "  " );
    fprintf( pFile, "  More" );
    fprintf( pFile, "     Ave" );
    fprintf( pFile, "     Max" );
    fprintf( pFile, "\n" );
    // print rows
    for ( i = 0; i <= p->nVars; i++ )
    {
        fprintf( pFile, "%2d :  ", i );
        fprintf( pFile, "%6d  ", pCountsAll[i] );
        for ( k = 0; k <= DSD_ARRAY_LIMIT; k++ )
//            fprintf( pFile, "%6d", pCounts[i][k] );
            fprintf( pFile, "%6.1f", 100.0*pCounts[i][k]/Abc_MaxInt(1,pCountsAll[i]) );
        fprintf( pFile, "  " );
//        fprintf( pFile, "%6d", pCounts[i][k] );
        fprintf( pFile, "%6.1f", 100.0*pCounts[i][k]/Abc_MaxInt(1,pCountsAll[i]) );
        fprintf( pFile, "  " );
        fprintf( pFile, "%6.1f", 1.0*pCountsSSizes[i]/Abc_MaxInt(1,pCountsAll[i]) );
        fprintf( pFile, "  " );
        fprintf( pFile, "%6d", pDecMax[i] );
        fprintf( pFile, "\n" );
    }
}